

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speculative.cpp
# Opt level: O1

llama_tokens *
common_speculative_gen_draft
          (llama_tokens *__return_storage_ptr__,common_speculative *spec,
          common_speculative_params params,llama_tokens *prompt_tgt,llama_token id_last)

{
  float *pfVar1;
  llama_token lVar2;
  iterator iVar3;
  pointer piVar4;
  common_speculative *pcVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  common_log *pcVar9;
  pointer piVar10;
  llama_token_data_array *plVar11;
  int *piVar12;
  size_t __n;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  pointer piVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  vector<int,std::allocator<int>> *pvVar24;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  llama_token id;
  llama_tokens *result;
  undefined8 in_stack_ffffffffffffff18;
  undefined4 uVar25;
  int local_ac;
  vector<int,std::allocator<int>> *local_a8;
  common_speculative *local_a0;
  llama_batch *local_98;
  llama_token local_8c;
  int local_88;
  allocator_type local_81;
  ulong local_80;
  ulong local_78;
  undefined8 local_70;
  string local_68;
  ulong local_48;
  vector<int,std::allocator<int>> *local_40;
  float local_34;
  
  uVar25 = (undefined4)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  local_34 = params.p_min;
  local_a8 = (vector<int,std::allocator<int>> *)__return_storage_ptr__;
  local_8c = id_last;
  iVar7 = llama_n_ctx(spec->ctx);
  iVar7 = iVar7 - params.n_draft;
  piVar10 = (prompt_tgt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar8 = (int)((ulong)((long)(prompt_tgt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar10) >> 2);
  uVar21 = iVar8 - iVar7;
  uVar22 = 0;
  if ((int)uVar21 < 1) {
    uVar21 = 0;
  }
  piVar17 = (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar19 = (ulong)((long)(spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar17) >> 2;
  local_80 = 0;
  uVar18 = (uint)uVar19;
  if (0 < (int)uVar18) {
    uVar20 = 0;
    local_80 = 0;
    uVar22 = 0;
    do {
      uVar13 = 0;
      if ((int)uVar21 < iVar8) {
        uVar14 = 0;
        while ((uVar19 & 0xffffffff) != uVar14) {
          uVar15 = uVar14;
          if ((piVar10[uVar21 + uVar14] != piVar17[uVar14]) ||
             (uVar14 = uVar14 + 1, uVar15 = (ulong)(iVar8 - uVar21), iVar8 - uVar21 == uVar14))
          goto LAB_00212279;
        }
        uVar15 = uVar19 & 0xffffffff;
LAB_00212279:
        uVar13 = (uint)uVar15;
      }
      if (((params.n_reuse <= (int)uVar13) || (iVar8 <= iVar7)) && ((int)uVar22 < (int)uVar13)) {
        uVar22 = (ulong)uVar13;
        local_80 = uVar20 & 0xffffffff;
      }
      uVar20 = uVar20 + 1;
      uVar19 = (ulong)((int)uVar19 - 1);
      piVar17 = piVar17 + 1;
    } while (uVar20 != (uVar18 & 0x7fffffff));
  }
  uVar19 = local_80;
  iVar7 = (int)uVar22;
  local_a0 = spec;
  local_70 = params._0_8_;
  if (0 < common_log_verbosity_thold) {
    pcVar9 = common_log_main();
    common_log_add(pcVar9,GGML_LOG_LEVEL_DEBUG,"%s: reuse_i = %d, reuse_n = %d, prompt = %d\n",
                   "common_speculative_gen_draft",uVar19,uVar22,
                   CONCAT44(uVar25,(int)((ulong)((long)(spec->prompt).
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(spec->prompt).
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start) >> 2
                                        )));
  }
  *(undefined8 *)local_a8 = 0;
  *(pointer *)(local_a8 + 8) = (pointer)0x0;
  *(pointer *)(local_a8 + 0x10) = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)local_a8,(long)(int)local_70);
  uVar6 = local_70;
  uVar20 = local_80;
  pvVar24 = local_a8;
  if (iVar7 == 0) {
    llama_kv_self_clear(spec->ctx);
    piVar10 = (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish == piVar10) goto LAB_0021246e;
  }
  else {
    iVar8 = (int)uVar19 + iVar7;
    piVar10 = (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((iVar8 < (int)((ulong)((long)(spec->prompt).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar10) >> 2
                      )) && (lVar16 = (long)iVar8, piVar10[lVar16] == local_8c)) {
      lVar23 = lVar16 * 4;
      do {
        lVar23 = lVar23 + 4;
        lVar16 = lVar16 + 1;
        piVar10 = (local_a0->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)(local_a0->prompt).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)piVar10) >> 2) <=
            lVar16) {
          return (llama_tokens *)pvVar24;
        }
        piVar12 = (int *)((long)piVar10 + lVar23);
        iVar3._M_current = *(int **)(pvVar24 + 8);
        if (iVar3._M_current == *(int **)(pvVar24 + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar24,iVar3,piVar12)
          ;
        }
        else {
          *iVar3._M_current = *piVar12;
          *(int **)(pvVar24 + 8) = iVar3._M_current + 1;
        }
      } while ((int)((ulong)(*(long *)(pvVar24 + 8) - *(long *)pvVar24) >> 2) < (int)uVar6);
      return (llama_tokens *)pvVar24;
    }
    if (0 < (int)local_80) {
      llama_kv_self_seq_rm(spec->ctx,0,0,local_80 & 0xffffffff);
      llama_kv_self_seq_add(spec->ctx,0,uVar20 & 0xffffffff,0xffffffff);
      piVar17 = (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar10 = piVar17 + (uVar20 & 0xffffffff);
      __n = (long)(spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar10;
      if (__n != 0) {
        memmove(piVar17,piVar10,__n);
      }
      piVar4 = (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar17 = (pointer)((long)piVar17 + ((long)piVar4 - (long)piVar10));
      if (piVar4 != piVar17) {
        (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = piVar17;
      }
    }
    if ((int)((ulong)((long)(spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2) <= iVar7) goto LAB_0021246e;
    llama_kv_self_seq_rm(spec->ctx,0,uVar22,0xffffffff);
    piVar10 = (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + uVar22;
    piVar17 = (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((piVar10 == piVar17) ||
       (piVar4 = (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,
       piVar10 = (pointer)((long)piVar10 + ((long)piVar4 - (long)piVar17)), piVar4 == piVar10))
    goto LAB_0021246e;
  }
  (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = piVar10;
LAB_0021246e:
  local_98 = &spec->batch;
  common_batch_clear(local_98);
  local_40 = (vector<int,std::allocator<int>> *)&spec->prompt;
  uVar19 = (ulong)(int)(uVar21 + iVar7);
  piVar10 = (prompt_tgt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (uVar19 < (ulong)((long)(prompt_tgt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar10 >> 2)) {
    lVar16 = uVar19 * 4;
    do {
      lVar2 = piVar10[uVar19];
      local_ac = 0;
      __l._M_len = 1;
      __l._M_array = &local_ac;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_68,__l,(allocator_type *)&local_88);
      common_batch_add(local_98,lVar2,(int)uVar22,(vector<int,_std::allocator<int>_> *)&local_68,
                       false);
      if (local_68._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_68._M_dataplus._M_p,
                        local_68.field_2._M_allocated_capacity - (long)local_68._M_dataplus._M_p);
      }
      piVar12 = (int *)((long)(prompt_tgt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start + lVar16);
      iVar3._M_current =
           (local_a0->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (local_a0->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(local_40,iVar3,piVar12);
      }
      else {
        *iVar3._M_current = *piVar12;
        (local_a0->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      uVar19 = uVar19 + 1;
      piVar10 = (prompt_tgt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar22 = (ulong)((int)uVar22 + 1);
      lVar16 = lVar16 + 4;
    } while (uVar19 < (ulong)((long)(prompt_tgt->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar10 >> 2))
    ;
  }
  pcVar5 = local_a0;
  if (0 < local_98->n_tokens) {
    llama_decode(local_a0->ctx);
  }
  uVar6 = local_70;
  pvVar24 = local_a8;
  local_78 = (ulong)((long)(pcVar5->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(pcVar5->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
  if (0 < common_log_verbosity_thold) {
    pcVar9 = common_log_main();
    common_log_add(pcVar9,GGML_LOG_LEVEL_DEBUG,"%s: n_past = %d\n","common_speculative_gen_draft",
                   local_78);
  }
  common_batch_clear(local_98);
  lVar2 = local_8c;
  local_ac = 0;
  __l_00._M_len = 1;
  __l_00._M_array = &local_ac;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_68,__l_00,(allocator_type *)&local_88);
  common_batch_add(local_98,lVar2,(llama_pos)local_78,(vector<int,_std::allocator<int>_> *)&local_68
                   ,true);
  if (local_68._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_68._M_dataplus._M_p,
                    local_68.field_2._M_allocated_capacity - (long)local_68._M_dataplus._M_p);
  }
  iVar3._M_current =
       (local_a0->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (local_a0->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(local_40,iVar3,&local_8c);
  }
  else {
    *iVar3._M_current = local_8c;
    (local_a0->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = iVar3._M_current + 1;
  }
  llama_decode(local_a0->ctx);
  common_sampler_reset(local_a0->smpl);
  if (0 < (int)uVar6) {
    local_78 = (ulong)((int)local_78 + 1);
    local_48 = 0;
    do {
      common_batch_clear(local_98);
      pcVar5 = local_a0;
      common_sampler_sample(local_a0->smpl,local_a0->ctx,0,true);
      plVar11 = common_sampler_get_candidates(pcVar5->smpl);
      if (0 < (int)plVar11->size) {
        lVar16 = 0;
        uVar22 = 0;
        do {
          if (0 < common_log_verbosity_thold) {
            pcVar9 = common_log_main();
            uVar21 = *(uint *)((long)&plVar11->data->id + lVar16);
            local_80 = CONCAT44(local_80._4_4_,*(undefined4 *)((long)&plVar11->data->p + lVar16));
            common_token_to_piece_abi_cxx11_
                      (&local_68,local_a0->ctx,*(llama_token *)((long)&plVar11->data->id + lVar16),
                       true);
            common_log_add(pcVar9,GGML_LOG_LEVEL_DEBUG,
                           " - draft candidate %3d, pos %3d: %6d (%8.3f) \'%s\'\n",
                           SUB84((double)(float)local_80,0),uVar22 & 0xffffffff,local_48,
                           (ulong)uVar21,local_68._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
          }
          uVar22 = uVar22 + 1;
          iVar7 = (int)plVar11->size;
          if (2 < iVar7) {
            iVar7 = 3;
          }
          lVar16 = lVar16 + 0xc;
        } while ((long)uVar22 < (long)iVar7);
      }
      pvVar24 = local_a8;
      local_ac = plVar11->data->id;
      common_sampler_accept(local_a0->smpl,local_ac,true);
      uVar6 = local_70;
      iVar3._M_current = *(int **)(pvVar24 + 8);
      if (iVar3._M_current == *(int **)(pvVar24 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar24,iVar3,&local_ac)
        ;
      }
      else {
        *iVar3._M_current = local_ac;
        *(int **)(pvVar24 + 8) = iVar3._M_current + 1;
      }
      iVar7 = local_ac;
      if ((int)(uint)uVar6 <= (int)((ulong)(*(long *)(pvVar24 + 8) - *(long *)pvVar24) >> 2)) {
        return (llama_tokens *)pvVar24;
      }
      pfVar1 = &plVar11->data->p;
      if (*pfVar1 <= local_34 && local_34 != *pfVar1) {
        return (llama_tokens *)pvVar24;
      }
      local_88 = 0;
      __l_01._M_len = 1;
      __l_01._M_array = &local_88;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_68,__l_01,&local_81);
      common_batch_add(local_98,iVar7,(int)local_78 + (int)local_48,
                       (vector<int,_std::allocator<int>_> *)&local_68,true);
      if (local_68._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_68._M_dataplus._M_p,
                        local_68.field_2._M_allocated_capacity - (long)local_68._M_dataplus._M_p);
      }
      llama_decode(local_a0->ctx);
      iVar3._M_current =
           (local_a0->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (local_a0->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_40,iVar3,&local_ac);
      }
      else {
        *iVar3._M_current = local_ac;
        (local_a0->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      uVar21 = (int)local_48 + 1;
      local_48 = (ulong)uVar21;
    } while (uVar21 != (uint)uVar6);
  }
  return (llama_tokens *)pvVar24;
}

Assistant:

llama_tokens common_speculative_gen_draft(
        struct common_speculative * spec,
        struct common_speculative_params params,
        const llama_tokens & prompt_tgt,
        llama_token id_last) {
    auto & batch  = spec->batch;
    auto & ctx    = spec->ctx;
    auto & smpl   = spec->smpl;
    auto & prompt = spec->prompt;

    int reuse_i = 0;
    int reuse_n = 0;

    const int n_ctx = llama_n_ctx(ctx) - params.n_draft;

    const int i_start = std::max<int>(0, (int) prompt_tgt.size() - n_ctx);

    // reuse as much as possible from the old draft context
    // ideally, the draft context should be as big as the target context and we will always reuse the entire prompt
    for (int i = 0; i < (int) prompt.size(); ++i) {
        int cur = 0;
        while (i_start + cur < (int) prompt_tgt.size() &&
               i       + cur < (int) prompt.size() &&
               prompt_tgt[i_start + cur] == prompt[i + cur]) {
            cur++;
        }

        if ((cur >= params.n_reuse || n_ctx >= (int) prompt_tgt.size()) && cur > reuse_n) {
            reuse_i = i;
            reuse_n = cur;
        }
    }

    LOG_DBG("%s: reuse_i = %d, reuse_n = %d, prompt = %d\n", __func__, reuse_i, reuse_n, (int) prompt.size());

    llama_tokens result;
    result.reserve(params.n_draft);

    if (reuse_n == 0) {
        llama_kv_self_clear(ctx);

        prompt.clear();
    } else {
        // this happens when a previous draft has been discarded (for example, due to being too small), but the
        // target model agreed with it. in this case, we simply pass back the previous results to save compute
        if (reuse_i + reuse_n < (int) prompt.size() && prompt[reuse_i + reuse_n] == id_last) {
            for (int i = reuse_i + reuse_n + 1; i < (int) prompt.size(); ++i) {
                result.push_back(prompt[i]);

                if (params.n_draft <= (int) result.size()) {
                    break;
                }
            }

            return result;
        }

        if (reuse_i > 0) {
            llama_kv_self_seq_rm (ctx, 0, 0, reuse_i);
            llama_kv_self_seq_add(ctx, 0, reuse_i, -1, -reuse_i);

            prompt.erase(prompt.begin(), prompt.begin() + reuse_i);
        }

        if (reuse_n < (int) prompt.size()) {
            llama_kv_self_seq_rm (ctx, 0, reuse_n, -1);

            prompt.erase(prompt.begin() + reuse_n, prompt.end());
        }
    }

    // prepare a batch to evaluate any new tokens in the prompt
    common_batch_clear(batch);

    for (size_t i = i_start + reuse_n; i < prompt_tgt.size(); ++i) {
        //LOG_DBG("i = %d, i_start = %d, reuse_n = %d, i - i_start = %d, id = %6d\n", i, i_start, reuse_n, i - i_start, prompt_tgt[i]);
        common_batch_add(batch, prompt_tgt[i], i - i_start, { 0 }, false);

        prompt.push_back(prompt_tgt[i]);
    }

    // we should rarely end-up here during normal decoding
    if (batch.n_tokens > 0) {
        //LOG_DBG("%s: draft prompt batch: %s\n", __func__, string_from(ctx, batch).c_str());

        llama_decode(ctx, batch);
    }

    const llama_pos n_past = prompt.size();

    LOG_DBG("%s: n_past = %d\n", __func__, n_past);

    common_batch_clear(batch);
    common_batch_add  (batch, id_last, n_past, { 0 }, true);

    prompt.push_back(id_last);

    //LOG_DBG("%s: draft prompt: %s\n", __func__, string_from(ctx, prompt).c_str());

    llama_decode(ctx, batch);

    common_sampler_reset(smpl);

    // sample n_draft tokens from the draft model
    for (int i = 0; i < params.n_draft; ++i) {
        common_batch_clear(batch);

        common_sampler_sample(smpl, ctx, 0, true);

        const auto * cur_p = common_sampler_get_candidates(smpl);

        for (int k = 0; k < std::min(3, (int) cur_p->size); ++k) {
            LOG_DBG(" - draft candidate %3d, pos %3d: %6d (%8.3f) '%s'\n",
                    k, i, cur_p->data[k].id, cur_p->data[k].p, common_token_to_piece(ctx, cur_p->data[k].id).c_str());
        }

        // add drafted token for each sequence
        const llama_token id = cur_p->data[0].id;

        common_sampler_accept(smpl, id, true);

        result.push_back(id);

        if (params.n_draft <= (int) result.size()) {
            break;
        }

        // only collect very high-confidence draft tokens
        if (cur_p->data[0].p < params.p_min) {
            break;
        }

        common_batch_add(batch, id, n_past + i + 1, { 0 }, true);

        // evaluate the drafted tokens on the draft model
        llama_decode(ctx, batch);

        prompt.push_back(id);
    }

    return result;
}